

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_data.cpp
# Opt level: O3

int AF_DObject_BAM(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
                  int numret)

{
  int iVar1;
  char *__assertion;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
  }
  else {
    if ((param->field_0).field_3.Type == '\x01') {
      if (numret < 1) {
        iVar1 = 0;
      }
      else {
        if (ret == (VMReturn *)0x0) {
          __assert_fail("ret != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/thingdef_data.cpp"
                        ,0x346,
                        "int AF_DObject_BAM(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
        }
        if (ret->RegType != '\0') {
          __assert_fail("RegType == REGT_INT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/vm/vm.h"
                        ,0x13f,"void VMReturn::SetInt(int)");
        }
        *(int *)ret->Location =
             SUB84((param->field_0).f * 11930464.711111112 + 6755399441055744.0,0);
        iVar1 = 1;
      }
      return iVar1;
    }
    __assertion = "param[paramnum].Type == REGT_FLOAT";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/thingdef_data.cpp"
                ,0x345,"int AF_DObject_BAM(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(DObject, BAM)
{
	PARAM_PROLOGUE;
	PARAM_FLOAT(ang);
	ACTION_RETURN_INT(DAngle(ang).BAMs());
}